

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall google::protobuf::compiler::Parser::~Parser(Parser *this)

{
  pointer pcVar1;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->upcoming_detached_comments_);
  pcVar1 = (this->upcoming_doc_comments_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->upcoming_doc_comments_).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->syntax_identifier_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->syntax_identifier_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

Parser::~Parser() {}